

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O1

void __thiscall
MT32Emu::Synth::configureMIDIEventQueueSysexStorage(Synth *this,Bit32u storageBufferSize)

{
  MidiEventQueue *pMVar1;
  
  if ((this->extensions->midiEventQueueSysexStorageBufferSize != storageBufferSize) &&
     (this->extensions->midiEventQueueSysexStorageBufferSize = storageBufferSize,
     this->midiQueue != (MidiEventQueue *)0x0)) {
    flushMIDIQueue(this);
    pMVar1 = this->midiQueue;
    if (pMVar1 != (MidiEventQueue *)0x0) {
      MidiEventQueue::~MidiEventQueue(pMVar1);
      operator_delete(pMVar1);
    }
    pMVar1 = (MidiEventQueue *)operator_new(0x20);
    MidiEventQueue::MidiEventQueue(pMVar1,this->extensions->midiEventQueueSize,storageBufferSize);
    this->midiQueue = pMVar1;
  }
  return;
}

Assistant:

void Synth::configureMIDIEventQueueSysexStorage(Bit32u storageBufferSize) {
	if (extensions.midiEventQueueSysexStorageBufferSize == storageBufferSize) return;

	extensions.midiEventQueueSysexStorageBufferSize = storageBufferSize;
	if (midiQueue != NULL) {
		flushMIDIQueue();
		delete midiQueue;
		midiQueue = new MidiEventQueue(extensions.midiEventQueueSize, storageBufferSize);
	}
}